

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  bool bVar7;
  string pdbPath;
  string compilePdbPath;
  allocator local_c9;
  string local_c8;
  string local_a8;
  key_type local_88;
  string local_68;
  string local_48;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)&local_a8,"MSVC_C_ARCHITECTURE_ID",(allocator *)&local_68);
  pcVar4 = cmMakefile::GetDefinition(this_00,&local_a8);
  bVar7 = true;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_48,"MSVC_CXX_ARCHITECTURE_ID",(allocator *)&local_88);
    pcVar4 = cmMakefile::GetDefinition(this_00,&local_48);
    bVar7 = true;
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_c8,"MSVC_CUDA_ARCHITECTURE_ID",&local_c9);
      pcVar4 = cmMakefile::GetDefinition(this_00,&local_c8);
      bVar7 = pcVar4 != (char *)0x0;
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar7 != false) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
              (&local_48,&this->super_cmCommonTargetGenerator);
    TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar3 == EXECUTABLE) ||
         (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar3 == STATIC_LIBRARY)) ||
        (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar3 == SHARED_LIBRARY)) ||
       (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar3 == MODULE_LIBRARY)) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_c8,pcVar1,psVar5);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::append((char *)&local_a8);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_c8,pcVar1,psVar5);
      std::__cxx11::string::append((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    pcVar2 = this->LocalGenerator;
    ConvertToNinjaPath(&local_68,this,&local_a8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_68,SHELL);
    std::__cxx11::string::string((string *)&local_88,"TARGET_PDB",&local_c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_88);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    pcVar2 = this->LocalGenerator;
    ConvertToNinjaPath(&local_68,this,&local_48);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_68,SHELL);
    std::__cxx11::string::string((string *)&local_88,"TARGET_COMPILE_PDB",&local_c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_88);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_68);
    EnsureParentDirectoryExists(this,&local_a8);
    EnsureParentDirectoryExists(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    return bVar7;
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB();
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}